

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_unlink_ignore_lyds(lyd_node **first_sibling_p,lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node *first_sibling;
  lyd_node *node_local;
  lyd_node **first_sibling_p_local;
  
  lyd_unlink_hash(node);
  if ((node->schema != (lysc_node *)0x0) && ((node->schema->nodetype & 0xc) != 0)) {
    lyd_free_leafref_nodes((lyd_node_term *)node);
  }
  if (node->next == (lyd_node *)0x0) {
    if ((first_sibling_p == (lyd_node **)0x0) || (*first_sibling_p == (lyd_node *)0x0)) {
      plVar1 = lyd_first_sibling(node);
      plVar1->prev = node->prev;
      if (first_sibling_p != (lyd_node **)0x0) {
        *first_sibling_p = plVar1;
      }
    }
    else {
      (*first_sibling_p)->prev = node->prev;
    }
    node->prev->next = (lyd_node *)0x0;
  }
  else {
    node->next->prev = node->prev;
    if (node->prev->next == (lyd_node *)0x0) {
      if (first_sibling_p != (lyd_node **)0x0) {
        *first_sibling_p = node->next;
      }
    }
    else {
      node->prev->next = node->next;
    }
  }
  if (node->parent != (lyd_node_inner *)0x0) {
    if (node->parent->child == node) {
      node->parent->child = node->next;
    }
    plVar1 = lyd_parent(node);
    lyd_np_cont_dflt_set(plVar1);
    node->parent = (lyd_node_inner *)0x0;
  }
  node->next = (lyd_node *)0x0;
  node->prev = node;
  return;
}

Assistant:

void
lyd_unlink_ignore_lyds(struct lyd_node **first_sibling_p, struct lyd_node *node)
{
    struct lyd_node *first_sibling;

    /* update hashes while still linked into the tree */
    lyd_unlink_hash(node);

    /* unlink leafref nodes */
    if (node->schema && (node->schema->nodetype & LYD_NODE_TERM)) {
        lyd_free_leafref_nodes((struct lyd_node_term *)node);
    }

    /* unlink from siblings */
    if (node->next) {
        node->next->prev = node->prev;
        if (node->prev->next) {
            node->prev->next = node->next;
        } else if (first_sibling_p) {
            /* unlinking the first node */
            *first_sibling_p = node->next;
        }
    } else {
        /* unlinking the last node */
        /* update the "last" pointer from the first node */
        if (first_sibling_p && *first_sibling_p) {
            (*first_sibling_p)->prev = node->prev;
        } else {
            first_sibling = lyd_first_sibling(node);
            first_sibling->prev = node->prev;
            if (first_sibling_p) {
                *first_sibling_p = first_sibling;
            }
        }
        node->prev->next = NULL;
    }

    /* unlink from parent */
    if (node->parent) {
        if (node->parent->child == node) {
            /* the node is the first child */
            node->parent->child = node->next;
        }

        /* check for NP container whether its last non-default node is not being unlinked */
        lyd_np_cont_dflt_set(lyd_parent(node));

        node->parent = NULL;
    }

    node->next = NULL;
    node->prev = node;
}